

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O2

bool __thiscall
adiak::value<std::array<float,3ul>>
          (adiak *this,string *name,array<float,_3UL> value,int category,string *subcategory)

{
  bool bVar1;
  int iVar2;
  adiak_datatype_t *dtype;
  adiak_value_t *value_00;
  undefined4 in_register_00000014;
  array<float,_3UL> local_38;
  
  local_38._M_elems[2] = value._M_elems[2];
  local_38._M_elems._0_8_ = value._M_elems._0_8_;
  dtype = internal::create_container_type<std::array<float,_3UL>_>::make_type();
  if (dtype != (adiak_datatype_t *)0x0) {
    value_00 = (adiak_value_t *)malloc(8);
    bVar1 = internal::create_container_type<std::array<float,_3UL>_>::make_value
                      (&local_38,value_00,dtype);
    if (bVar1) {
      iVar2 = adiak_raw_namevalue(*(char **)this,(int)name,
                                  *(char **)CONCAT44(in_register_00000014,category),value_00,dtype);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool value(std::string name, T value, int category = adiak_general, std::string subcategory = "") {
      adiak_datatype_t *datatype = adiak::internal::parse<T>::make_type();
      if (!datatype)
         return false;
      adiak_value_t *avalue = (adiak_value_t *) malloc(sizeof(adiak_value_t));
      bool result = adiak::internal::parse<T>::make_value(value, avalue, datatype);
      if (!result)
         return false;
      return adiak_raw_namevalue(name.c_str(), category, subcategory.c_str(), avalue, datatype) == 0;
   }